

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O3

bool __thiscall
Omega_h::CmdLineFlag::parse_impl(CmdLineFlag *this,int *p_argc,char **argv,int i,bool should_print)

{
  int iVar1;
  pointer puVar2;
  CmdLineItem *pCVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  iterator __begin1;
  pointer puVar8;
  char *pcVar9;
  undefined7 in_register_00000081;
  char local_3d;
  undefined4 local_3c;
  CmdLineFlag *local_38;
  
  iVar1 = *p_argc;
  iVar5 = iVar1 + -1;
  *p_argc = iVar5;
  if (i < iVar5) {
    lVar7 = (long)i + 1;
    do {
      argv[lVar7 + -1] = argv[lVar7];
      lVar7 = lVar7 + 1;
    } while (iVar1 != lVar7);
  }
  puVar8 = (this->args_).
           super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->args_).
           super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar5 - i < (int)((ulong)((long)puVar2 - (long)puVar8) >> 3)) {
    if (should_print) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"flag ",5);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->super_CmdLineItem).name_._M_dataplus._M_p,
                          (this->super_CmdLineItem).name_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," takes ",7);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      pcVar9 = " arguments\n";
      lVar7 = 0xb;
LAB_0024aec0:
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,lVar7);
    }
LAB_0024aec8:
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (puVar8 != puVar2) {
      local_3c = (undefined4)CONCAT71(in_register_00000081,should_print);
      local_38 = this;
      do {
        bVar4 = CmdLineItem::parse((puVar8->_M_t).
                                   super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                                   .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>.
                                   _M_head_impl,p_argc,argv,i,should_print);
        if (!bVar4) {
          if ((char)local_3c == '\0') goto LAB_0024aec8;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"could not parse argument <",0x1a);
          pCVar3 = (puVar8->_M_t).
                   super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                   .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(pCVar3->name_)._M_dataplus._M_p,
                              (pCVar3->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"> of flag ",10);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(local_38->super_CmdLineItem).name_._M_dataplus._M_p,
                              (local_38->super_CmdLineItem).name_._M_string_length);
          pcVar9 = &local_3d;
          local_3d = '\n';
          lVar7 = 1;
          goto LAB_0024aec0;
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar2);
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool CmdLineFlag::parse_impl(
    int* p_argc, char** argv, int i, bool should_print) {
  shift(p_argc, argv, i);
  if (((*p_argc) - i) < int(args_.size())) {
    if (should_print) {
      std::cout << "flag " << name() << " takes " << args_.size()
                << " arguments\n";
    }
    return false;
  }
  for (auto const& the_arg : args_) {
    if (!the_arg->parse(p_argc, argv, i, should_print)) {
      if (should_print) {
        std::cout << "could not parse argument <" << the_arg->name()
                  << "> of flag " << name() << '\n';
      }
      return false;
    }
  }
  return true;
}